

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md4c.c
# Opt level: O3

int md_analyze_inlines(MD_CTX *ctx,MD_LINE *lines,MD_SIZE n_lines,int table_mode)

{
  char cVar1;
  uint uVar2;
  uint closer_index;
  int i;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  char *pcVar7;
  MD_CTX *pMVar8;
  ulong uVar9;
  MD_MARK *pMVar10;
  void *pvVar11;
  long lVar12;
  uint uVar13;
  byte bVar14;
  byte bVar15;
  int iVar16;
  undefined4 in_register_00000014;
  ulong uVar17;
  byte *pbVar18;
  byte bVar19;
  byte bVar20;
  uint uVar21;
  MD_OFFSET MVar22;
  MD_SIZE MVar23;
  uint uVar24;
  uint uVar25;
  uint uVar26;
  MD_MARK *pMVar27;
  ulong uVar28;
  int iVar29;
  MD_CTX *ctx_00;
  MD_OFFSET *pMVar30;
  MD_MARK *pMVar31;
  undefined4 uVar32;
  MD_CTX *pMVar33;
  MD_CHAR *pMVar34;
  MD_LINE *lines_00;
  ulong uVar35;
  MD_MARK *pMVar36;
  MD_OFFSET MVar37;
  MD_OFFSET *pMVar38;
  uint uVar39;
  ulong uVar40;
  MD_MARK *pMVar41;
  MD_OFFSET max_end;
  bool bVar42;
  bool bVar43;
  MD_SIZE *p_size;
  MD_CTX *pMVar44;
  MD_CTX *local_150;
  ulong local_138;
  ulong local_128;
  MD_OFFSET local_120;
  MD_SIZE tmp_line_index;
  MD_OFFSET *local_118;
  undefined8 local_110;
  ulong local_108;
  MD_MARK *local_100;
  ulong local_f8;
  ulong local_f0;
  int local_e4;
  MD_OFFSET title_contents_end;
  MD_OFFSET title_contents_beg;
  MD_OFFSET *local_d8;
  MD_OFFSET *local_d0;
  MD_CTX *local_c8;
  MD_SIZE local_bc;
  MD_OFFSET codespan_last_potential_closers [32];
  
  local_110 = CONCAT44(in_register_00000014,n_lines);
  ctx->n_marks = 0;
  codespan_last_potential_closers[0x1c] = 0;
  codespan_last_potential_closers[0x1d] = 0;
  codespan_last_potential_closers[0x1e] = 0;
  codespan_last_potential_closers[0x1f] = 0;
  codespan_last_potential_closers[0x18] = 0;
  codespan_last_potential_closers[0x19] = 0;
  codespan_last_potential_closers[0x1a] = 0;
  codespan_last_potential_closers[0x1b] = 0;
  codespan_last_potential_closers[0x14] = 0;
  codespan_last_potential_closers[0x15] = 0;
  codespan_last_potential_closers[0x16] = 0;
  codespan_last_potential_closers[0x17] = 0;
  codespan_last_potential_closers[0x10] = 0;
  codespan_last_potential_closers[0x11] = 0;
  codespan_last_potential_closers[0x12] = 0;
  codespan_last_potential_closers[0x13] = 0;
  codespan_last_potential_closers[0xc] = 0;
  codespan_last_potential_closers[0xd] = 0;
  codespan_last_potential_closers[0xe] = 0;
  codespan_last_potential_closers[0xf] = 0;
  codespan_last_potential_closers[8] = 0;
  codespan_last_potential_closers[9] = 0;
  codespan_last_potential_closers[10] = 0;
  codespan_last_potential_closers[0xb] = 0;
  codespan_last_potential_closers[4] = 0;
  codespan_last_potential_closers[5] = 0;
  codespan_last_potential_closers[6] = 0;
  codespan_last_potential_closers[7] = 0;
  codespan_last_potential_closers[0] = 0;
  codespan_last_potential_closers[1] = 0;
  codespan_last_potential_closers[2] = 0;
  codespan_last_potential_closers[3] = 0;
  ctx_00 = ctx;
  local_e4 = table_mode;
  if (n_lines != 0) {
    local_f8 = (ulong)(n_lines - 1);
    local_d8 = &ctx->html_comment_horizon;
    local_118 = &ctx->html_proc_instr_horizon;
    local_d0 = &ctx->html_decl_horizon;
    local_c8 = (MD_CTX *)&ctx->html_cdata_horizon;
    uVar5 = 0;
    local_108 = local_108 & 0xffffffff00000000;
LAB_00107d24:
    lines_00 = lines + uVar5;
    uVar17 = (ulong)lines_00->beg;
    pMVar44 = ctx_00;
LAB_00107d37:
    local_128 = uVar5;
    ctx_00 = pMVar44;
    uVar3 = lines_00->end;
    uVar13 = (uint)uVar17;
    if ((uint)uVar17 + 3 < uVar3) {
      pMVar34 = ctx->text;
      do {
        uVar39 = (uint)uVar17;
        uVar13 = uVar39;
        if ((((ctx->mark_char_map[(byte)pMVar34[uVar17 & 0xffffffff]] != '\0') ||
             (ctx->mark_char_map[(byte)pMVar34[uVar39 + 1]] != '\0')) ||
            (ctx->mark_char_map[(byte)pMVar34[uVar39 + 2]] != '\0')) ||
           (ctx->mark_char_map[(byte)pMVar34[uVar39 + 3]] != '\0')) break;
        uVar13 = uVar39 + 4;
        uVar17 = (ulong)uVar13;
      } while (uVar39 + 7 < uVar3);
    }
    iVar16 = (int)local_128;
    if (uVar3 <= uVar13) goto LAB_00109061;
    uVar40 = (ulong)uVar3;
    pMVar33 = (MD_CTX *)ctx->text;
    uVar6 = (ulong)uVar13;
    uVar39 = uVar13 + 3;
    uVar21 = uVar13 + 2;
    uVar9 = uVar6;
    while( true ) {
      uVar17 = (ulong)uVar13;
      uVar35 = (ulong)uVar39;
      uVar6 = uVar6 + 1;
      uVar28 = uVar9 + 1;
      if (ctx->mark_char_map[*(byte *)((long)&pMVar33->text + uVar9)] != '\0') break;
      uVar39 = uVar39 + 1;
      uVar21 = uVar21 + 1;
      uVar13 = uVar13 + 1;
      uVar9 = uVar28;
      if ((uint)uVar28 == uVar3) goto LAB_00109061;
    }
    uVar13 = (uint)uVar9;
    uVar9 = uVar9 & 0xffffffff;
    bVar20 = *(byte *)((long)&pMVar33->text + uVar9);
    uVar39 = (uint)bVar20;
    pMVar44 = ctx_00;
    uVar5 = local_128;
    if (bVar20 == 0x5c) {
      if (ctx->size <= (uint)(uVar9 + 1)) goto switchD_001080bb_caseD_5c;
      bVar19 = *(byte *)((long)&pMVar33->text + uVar9 + 1);
      if ((byte)(bVar19 - 0x21) < 0xf) {
LAB_00108221:
        pMVar10 = md_add_mark(ctx);
        if (pMVar10 == (MD_MARK *)0x0) goto LAB_00109aa0;
        pMVar10->beg = uVar13;
        uVar17 = (ulong)(uVar13 + 2);
        pMVar10->end = uVar13 + 2;
        pMVar10->prev = -1;
        pMVar10->next = -1;
        pMVar10->ch = '\\';
        pMVar10->flags = '\x10';
        ctx = ctx_00;
        pMVar44 = ctx_00;
      }
      else {
        if (0x5a < bVar19) {
          uVar21 = bVar19 - 0x5b;
          if ((0x23 < uVar21) || ((0xf0000003fU >> ((ulong)uVar21 & 0x3f) & 1) == 0))
          goto switchD_001080bb_caseD_5c;
          goto LAB_00108221;
        }
        if (bVar19 - 0x3a < 7) goto LAB_00108221;
        if ((bVar19 != 10) && (bVar19 != 0xd)) goto switchD_001080bb_caseD_5c;
        if (iVar16 + 1U < (uint)local_110) goto LAB_00108221;
        uVar17 = (ulong)(uVar13 + 2);
      }
      goto LAB_00107d37;
    }
    if (0x2d < bVar20) {
      switch(bVar20) {
      case 0x3a:
        MVar22 = lines_00->beg;
        uVar17 = (ulong)(uVar13 + 1);
        lVar12 = 8;
        do {
          uVar39 = *(uint *)((long)&md_collect_marks_scheme_map + lVar12);
          if (uVar39 + MVar22 <= uVar13) {
            ctx = ctx_00;
            iVar16 = bcmp((void *)((long)&pMVar33->text + (ulong)(uVar13 - uVar39)),
                          *(void **)((long)&md_get_unicode_fold_info::FOLD_MAP_LIST[2].n_codepoints
                                    + lVar12),(ulong)uVar39);
            ctx_00 = ctx;
            if (((iVar16 == 0) && (uVar13 + 3 < uVar3)) &&
               (*(short *)((long)&pMVar33->text + uVar17) == 0x2f2f)) {
              pMVar10 = md_add_mark(ctx);
              if (pMVar10 == (MD_MARK *)0x0) goto LAB_00109aa0;
              pMVar10->beg = uVar13 - uVar39;
              pMVar10->end = uVar13 + 3;
              pMVar10->prev = -1;
              pMVar10->next = -1;
              pMVar10->ch = ':';
              pMVar10->flags = '\x01';
              pMVar10 = md_add_mark(ctx);
              if (pMVar10 == (MD_MARK *)0x0) goto LAB_00109aa0;
              MVar22 = lines_00->end;
              pMVar10->beg = lines_00->beg;
              pMVar10->end = MVar22;
              pMVar10->prev = -1;
              pMVar10->next = -1;
              pMVar10->ch = 'D';
              pMVar10->flags = '\0';
              uVar17 = (ulong)(uVar13 + 4);
              pMVar44 = ctx;
              break;
            }
          }
          lVar12 = lVar12 + 0x20;
          pMVar44 = ctx_00;
        } while (lVar12 != 0x68);
        goto LAB_00107d37;
      case 0x3b:
        if ((0 < (long)ctx->n_marks) && (ctx->marks[(long)ctx->n_marks + -1].ch == '&')) {
          pMVar10 = md_add_mark(ctx);
          ctx = ctx_00;
          if (pMVar10 == (MD_MARK *)0x0) goto LAB_00109aa0;
          pMVar10->beg = uVar13;
          pMVar10->end = uVar13 + 1;
          pMVar10->prev = -1;
          pMVar10->next = -1;
          pMVar10->ch = ';';
          pMVar10->flags = '\x02';
          ctx_00 = ctx;
        }
        break;
      case 0x3c:
        uVar3 = lines[local_f8].end;
        if (((ctx->parser).flags & 0x40) == 0) {
          MVar23 = (uint)local_110 - iVar16;
          iVar16 = md_is_html_tag(ctx,lines_00,MVar23,uVar13,uVar3,&tmp_line_index);
          if (iVar16 == 0) {
            uVar39 = lines_00->end;
            if ((((uVar13 + 4 < uVar39) &&
                 (*(char *)((long)&pMVar33->text + (uVar28 & 0xffffffff)) == '!')) &&
                (*(char *)((long)&pMVar33->text + (ulong)(uVar13 + 2)) == '-')) &&
               (*(char *)((long)&pMVar33->text + (ulong)(uVar13 + 3)) == '-')) {
              iVar16 = md_scan_for_html_closer
                                 (ctx_00,"-->",3,lines_00,MVar23,uVar13 + 2,uVar3,&tmp_line_index,
                                  local_d8);
              if (iVar16 != 0) goto LAB_001083f9;
              uVar39 = lines_00->end;
              pMVar33 = (MD_CTX *)ctx_00->text;
            }
            uVar25 = uVar13 + 2;
            if ((uVar25 < uVar39) &&
               (*(char *)((long)&pMVar33->text + (uVar28 & 0xffffffff)) == '?')) {
              iVar16 = md_scan_for_html_closer
                                 (ctx_00,"?>",2,lines_00,MVar23,uVar25,uVar3,&tmp_line_index,
                                  local_118);
              if (iVar16 != 0) goto LAB_001083f9;
              uVar39 = lines_00->end;
              pMVar33 = (MD_CTX *)ctx_00->text;
            }
            if (((uVar25 < uVar39) &&
                (*(char *)((long)&pMVar33->text + (uVar28 & 0xffffffff)) == '!')) &&
               ((byte)((*(byte *)((long)&pMVar33->text + (ulong)uVar25) & 0xdf) + 0xbf) < 0x1a)) {
              uVar25 = uVar13 + 3;
              if (uVar13 + 3 < uVar39) {
                pbVar18 = (byte *)((long)&pMVar33->text + uVar35);
                uVar17 = uVar35;
                do {
                  uVar25 = (MD_OFFSET)uVar17;
                  if (0x19 < (byte)((*pbVar18 & 0xdf) + 0xbf)) break;
                  uVar26 = (MD_OFFSET)uVar17 + 1;
                  uVar17 = (ulong)uVar26;
                  pbVar18 = pbVar18 + 1;
                  uVar25 = uVar39;
                } while (uVar39 != uVar26);
              }
              iVar16 = md_scan_for_html_closer
                                 (ctx_00,">",1,lines_00,MVar23,uVar25,uVar3,&tmp_line_index,local_d0
                                 );
              if (iVar16 != 0) goto LAB_001083f9;
              uVar39 = lines_00->end;
              pMVar33 = (MD_CTX *)ctx_00->text;
            }
            ctx = ctx_00;
            if ((uVar13 + 9 < uVar39) &&
               (*(char *)((long)&pMVar33->size + uVar9) == '[' &&
                *(long *)((long)&pMVar33->text + uVar9) == 0x41544144435b213c)) {
              iVar16 = md_scan_for_html_closer
                                 (ctx_00,"]]>",3,lines_00,MVar23,uVar13 + 9,uVar3,&tmp_line_index,
                                  (MD_OFFSET *)local_c8);
              if (iVar16 != 0) goto LAB_001083f9;
              pMVar33 = (MD_CTX *)ctx_00->text;
              ctx = ctx_00;
            }
            uVar3 = lines[local_f8].end;
            ctx_00 = ctx;
            goto LAB_00108c1a;
          }
LAB_001083f9:
          pMVar44 = ctx_00;
          pMVar10 = md_add_mark(ctx_00);
          if (pMVar10 == (MD_MARK *)0x0) goto LAB_00109aa0;
          pMVar10->beg = uVar13;
          pMVar10->end = uVar13;
          pMVar10->prev = -1;
          pMVar10->next = -1;
          pMVar10->ch = '<';
          pMVar10->flags = '\x14';
          pMVar10 = md_add_mark(ctx_00);
          if (pMVar10 == (MD_MARK *)0x0) goto LAB_00109aa0;
          uVar17 = (ulong)tmp_line_index;
          pMVar10->beg = tmp_line_index;
          pMVar10->end = tmp_line_index;
          pMVar10->prev = -1;
          pMVar10->next = -1;
          pMVar10->ch = '>';
          pMVar10->flags = '\x18';
          iVar16 = ctx_00->n_marks;
          pMVar10 = ctx_00->marks;
          pMVar10[(long)iVar16 + -2].next = iVar16 + -1;
          pMVar10[(long)iVar16 + -1].prev = iVar16 + -2;
          ctx = ctx_00;
          if (lines_00->end < tmp_line_index) {
            uVar3 = 0;
            uVar6 = local_f8;
            do {
              iVar16 = (int)uVar6;
              uVar13 = iVar16 + uVar3 >> 1;
              uVar5 = (ulong)uVar13;
              lines_00 = lines + uVar5;
              if (tmp_line_index < lines_00->beg) {
                if ((iVar16 == 0) || (lines[iVar16 - 1].end < tmp_line_index)) goto LAB_00107d37;
                uVar6 = (ulong)(uVar13 - 1);
              }
              else {
                if (tmp_line_index <= lines_00->end) goto LAB_00107d37;
                uVar3 = uVar13 + 1;
              }
            } while (uVar3 <= (uint)uVar6);
            goto LAB_00108f52;
          }
        }
        else {
LAB_00108c1a:
          uVar39 = uVar13 + 1;
          uVar17 = (ulong)uVar39;
          pMVar44 = ctx_00;
          if (uVar39 < uVar3) {
            uVar6 = (ulong)uVar39;
            if ((uVar13 + 2 < uVar3) && (-1 < *(char *)((long)&pMVar33->text + uVar6))) {
              uVar40 = (ulong)(uVar13 + 2);
              uVar25 = 2;
              uVar9 = uVar35;
              while (uVar25 < 0x21) {
                bVar20 = *(byte *)((long)&pMVar33->text + uVar40);
                if ((2 < uVar25) && (bVar20 == 0x3a)) {
                  if ((uint)uVar40 < uVar3) goto LAB_00108d1f;
                  break;
                }
                if (((9 < (byte)(bVar20 - 0x30)) && (0x19 < (byte)((bVar20 & 0xdf) + 0xbf))) &&
                   ((0x2e < bVar20 || ((0x680000000000U >> ((ulong)(uint)bVar20 & 0x3f) & 1) == 0)))
                   ) break;
                uVar40 = uVar40 + 1;
                uVar25 = uVar25 + 1;
                uVar9 = (ulong)((int)uVar9 + 1);
                if (uVar3 == (uint)uVar40) break;
              }
            }
LAB_00108d73:
            do {
              uVar9 = (ulong)uVar21;
              bVar20 = *(byte *)((long)&pMVar33->text + uVar6);
              if (((9 < (byte)(bVar20 - 0x30)) && (0x19 < (byte)((bVar20 & 0xdf) + 0xbf))) &&
                 ((bVar20 == 0 ||
                  (ctx = ctx_00, pvVar11 = memchr(".!#$%&\'*+/=?^_`{|}~-",(int)(char)bVar20,0x15),
                  ctx_00 = ctx, pvVar11 == (void *)0x0)))) {
                pMVar44 = ctx_00;
                if ((uVar39 < (uint)uVar6) &&
                   (*(char *)((long)&pMVar33->text + (uVar6 & 0xffffffff)) == '@')) {
                  iVar16 = 0;
                  goto LAB_00108de0;
                }
                break;
              }
              uVar6 = uVar6 + 1;
              uVar35 = (ulong)((int)uVar35 + 1);
              uVar21 = uVar21 + 1;
              pMVar44 = ctx_00;
            } while (uVar3 != (uint)uVar6);
          }
        }
        goto LAB_00107d37;
      case 0x3d:
      case 0x3e:
      case 0x3f:
        goto switchD_001080bb_caseD_5c;
      case 0x40:
        if (lines_00->beg + 1 <= uVar13) {
          bVar20 = *(byte *)((long)&pMVar33->text + (ulong)(uVar13 - 1));
          if ((byte)((bVar20 & 0xdf) + 0xbf) < 0x1a) {
            if (uVar13 + 3 < uVar3) {
LAB_00108912:
              bVar20 = *(byte *)((long)&pMVar33->text + uVar9 + 1);
              if (((byte)(bVar20 - 0x30) < 10) || ((byte)((bVar20 & 0xdf) + 0xbf) < 0x1a)) {
                pMVar10 = md_add_mark(ctx);
                if (pMVar10 == (MD_MARK *)0x0) goto LAB_00109aa0;
                pMVar10->beg = uVar13;
                pMVar10->end = uVar13 + 1;
                pMVar10->prev = -1;
                pMVar10->next = -1;
                pMVar10->ch = '@';
                pMVar10->flags = '\x01';
                ctx = ctx_00;
                pMVar10 = md_add_mark(ctx_00);
                if (pMVar10 == (MD_MARK *)0x0) goto LAB_00109aa0;
                MVar22 = lines_00->end;
                pMVar10->beg = lines_00->beg;
                pMVar10->end = MVar22;
                pMVar10->prev = -1;
                pMVar10->next = -1;
                pMVar10->ch = 'D';
                pMVar10->flags = '\0';
                ctx_00 = ctx;
              }
            }
          }
          else if ((uVar13 + 3 < uVar3) && ((byte)(bVar20 - 0x30) < 10)) goto LAB_00108912;
        }
        break;
      default:
        switch(bVar20) {
        case 0x5b:
          iVar16 = 1;
LAB_001080e0:
          pMVar10 = md_add_mark(ctx);
          if (pMVar10 == (MD_MARK *)0x0) goto LAB_00109aa0;
          uVar3 = iVar16 + uVar13;
          pMVar10->beg = uVar13;
          pMVar10->end = uVar3;
          pMVar10->prev = -1;
          pMVar10->next = -1;
          pMVar10->ch = bVar20;
          pMVar10->flags = '\x01';
          pMVar10 = md_add_mark(ctx_00);
          if (pMVar10 == (MD_MARK *)0x0) goto LAB_00109aa0;
          pMVar10->beg = uVar3;
          pMVar10->end = uVar3;
          pMVar10->prev = -1;
          pMVar10->next = -1;
          pMVar10->ch = 'D';
          pMVar10->flags = '\0';
          pMVar10 = md_add_mark(ctx_00);
          if (pMVar10 == (MD_MARK *)0x0) goto LAB_00109aa0;
          pMVar10->beg = uVar3;
          pMVar10->end = uVar3;
          pMVar10->prev = -1;
          pMVar10->next = -1;
          pMVar10->ch = 'D';
          pMVar10->flags = '\0';
          uVar17 = (ulong)uVar3;
          ctx = ctx_00;
          pMVar44 = ctx_00;
          goto LAB_00107d37;
        case 0x5c:
        case 0x5e:
          break;
        case 0x5d:
          pMVar10 = md_add_mark(ctx);
          ctx = ctx_00;
          if (pMVar10 == (MD_MARK *)0x0) goto LAB_00109aa0;
          pMVar10->beg = uVar13;
          uVar17 = (ulong)(uVar13 + 1);
          pMVar10->end = uVar13 + 1;
          pMVar10->prev = -1;
          pMVar10->next = -1;
          pMVar10->ch = ']';
          pMVar10->flags = '\x02';
          pMVar44 = ctx;
          goto LAB_00107d37;
        case 0x5f:
switchD_001080bb_caseD_5f:
          MVar22 = uVar13 + 1;
          uVar17 = (ulong)MVar22;
          if (MVar22 < uVar3) {
            uVar17 = uVar28 & 0xffffffff;
            do {
              if (*(byte *)((long)&pMVar33->text + uVar17) != bVar20) goto LAB_00107e92;
              uVar17 = uVar17 + 1;
            } while (uVar17 < uVar40);
            uVar17 = (ulong)uVar3;
          }
LAB_00107e92:
          MVar37 = (MD_OFFSET)uVar17;
          bVar43 = false;
          bVar19 = 0;
          if (uVar13 != lines_00->beg) {
            uVar39 = md_decode_utf8_before__(pMVar33,uVar13);
            ctx = ctx_00;
            iVar16 = md_is_unicode_whitespace__(uVar39);
            bVar43 = false;
            bVar19 = 0;
            ctx_00 = ctx;
            if (iVar16 == 0) {
              iVar16 = md_is_unicode_punct__(uVar39);
              bVar43 = iVar16 == 0;
              bVar19 = bVar43 + 1;
              ctx_00 = ctx;
            }
          }
          bVar14 = 0;
          bVar42 = false;
          if (MVar37 != uVar3) {
            pMVar34 = (MD_CHAR *)((long)&pMVar33->text + (uVar17 & 0xffffffff));
            MVar23 = ctx->size - MVar37;
            bVar42 = false;
            uVar3 = md_decode_utf8__(pMVar34,MVar23,(MD_SIZE *)0x0);
            ctx = ctx_00;
            iVar16 = md_is_unicode_whitespace__(uVar3);
            bVar14 = 0;
            ctx_00 = ctx;
            if (iVar16 == 0) {
              uVar3 = md_decode_utf8__(pMVar34,MVar23,(MD_SIZE *)0x0);
              iVar16 = md_is_unicode_punct__(uVar3);
              bVar42 = iVar16 == 0;
              bVar14 = bVar42 + 1;
              ctx_00 = ctx;
            }
          }
          if ((bool)(bVar20 == 0x5f & bVar43 & bVar42)) {
            bVar19 = 0;
            bVar14 = 0;
          }
          uVar17 = uVar17 & 0xffffffff;
          pMVar44 = ctx_00;
          if (bVar19 != 0 || bVar14 != 0) {
            pMVar10 = md_add_mark(ctx);
            if (pMVar10 == (MD_MARK *)0x0) goto LAB_00109aa0;
            bVar15 = (bVar14 <= bVar19) * '\x02';
            if (bVar19 == 0) {
              bVar15 = 0;
            }
            bVar15 = (bVar19 <= bVar14 && bVar14 != 0) | bVar15;
            if (bVar15 == 3) {
              bVar15 = 0x23;
            }
            pMVar10->beg = uVar13;
            pMVar10->end = MVar37;
            pMVar10->prev = -1;
            pMVar10->next = -1;
            pMVar10->ch = bVar20;
            pMVar10->flags = (bVar15 | (byte)((MVar37 - uVar13) % 3 << 6)) + 0x40;
            uVar17 = (ulong)MVar22;
            ctx = ctx_00;
            pMVar44 = ctx_00;
            if (MVar22 < MVar37) {
              do {
                pMVar10 = md_add_mark(ctx_00);
                if (pMVar10 == (MD_MARK *)0x0) goto LAB_00109aa0;
                pMVar10->beg = MVar22;
                pMVar10->end = MVar22;
                pMVar10->prev = -1;
                pMVar10->next = -1;
                pMVar10->ch = 'D';
                pMVar10->flags = '\0';
                MVar22 = MVar22 + 1;
              } while (MVar22 < MVar37);
              goto LAB_00108088;
            }
          }
          goto LAB_00107d37;
        case 0x60:
          pcVar7 = (char *)((long)&pMVar33->text + uVar17);
          do {
            if (*pcVar7 != '`') {
              uVar32 = CONCAT31((int3)(uVar3 >> 8),*pcVar7 == ' ');
              goto LAB_00108793;
            }
            uVar39 = (int)uVar17 + 1;
            uVar17 = (ulong)uVar39;
            pcVar7 = pcVar7 + 1;
          } while (uVar3 != uVar39);
          uVar32 = 0;
          uVar17 = (ulong)uVar3;
LAB_00108793:
          MVar22 = (MD_OFFSET)uVar17;
          uVar39 = MVar22 - uVar13;
          if (((uVar39 < 0x21) &&
              (codespan_last_potential_closers[uVar39 - 1] <
               lines_00[((uint)local_110 - iVar16) - 1].end)) &&
             (((int)local_108 == 0 || (MVar22 <= codespan_last_potential_closers[uVar39 - 1])))) {
            local_100 = (MD_MARK *)CONCAT44(local_100._4_4_,uVar32);
            local_138 = 0;
            bVar43 = true;
            uVar6 = uVar17;
            uVar21 = uVar3;
            do {
              uVar9 = (ulong)uVar21;
              do {
                if ((uint)uVar6 < uVar21) {
                  uVar40 = uVar6 & 0xffffffff;
                  do {
                    cVar1 = *(char *)((long)&pMVar33->text + uVar40);
                    if (cVar1 != ' ') {
                      if (cVar1 == '`') goto LAB_00108827;
                      bVar43 = false;
                    }
                    uVar40 = uVar40 + 1;
                    uVar25 = uVar21;
                  } while (uVar9 != uVar40);
LAB_00108873:
                  bVar42 = false;
                  uVar6 = uVar9;
                }
                else {
                  uVar40 = uVar6 & 0xffffffff;
LAB_00108827:
                  uVar25 = (uint)uVar40;
                  if (uVar25 < uVar21) {
                    uVar6 = uVar40 & 0xffffffff;
                    bVar42 = true;
                    if (*(char *)((long)&pMVar33->text + uVar6) == '`') {
                      lVar12 = 0;
                      pMVar8 = pMVar33;
                      do {
                        pMVar8 = (MD_CTX *)((long)&pMVar8->text + 1);
                        if ((1 - uVar9) + uVar6 == lVar12) goto LAB_00108873;
                        lVar12 = lVar12 + -1;
                      } while (*(char *)((long)&pMVar8->text + uVar6) == '`');
                      uVar6 = uVar6 - lVar12;
                      bVar42 = uVar6 < uVar9;
                      goto LAB_00108876;
                    }
                  }
                  else {
                    bVar42 = false;
                  }
                  uVar6 = uVar40 & 0xffffffff;
                }
LAB_00108876:
                uVar24 = (uint)uVar6;
                uVar26 = uVar24 - uVar25;
                if (uVar39 == uVar26) {
                  if (lines_00[local_138].beg < uVar25) {
                    bVar42 = *(char *)((long)&pMVar33->text + (ulong)(uVar25 - 1)) == ' ';
                  }
                  else {
                    bVar42 = false;
                  }
                  if ((((MVar22 != uVar3 & ((byte)uVar32 ^ 1)) != 0) || (bVar43)) ||
                     (uVar25 != lines_00[local_138].beg && !bVar42)) goto LAB_00108e89;
                  if ((byte)uVar32 == 0) {
                    MVar22 = lines_00[1].beg;
                  }
                  else {
                    MVar22 = MVar22 + 1;
                  }
                  if (bVar42) {
                    uVar25 = uVar25 - 1;
                    goto LAB_00108e89;
                  }
                  uVar25 = lines_00[(int)local_138 - 1].end;
                  uVar17 = (ulong)uVar25;
                  uVar3 = ctx_00->size;
                  if (uVar3 <= uVar25) goto LAB_00108e89;
                  pcVar7 = (char *)((long)&pMVar33->text + uVar17);
                  goto LAB_00108e6e;
                }
                if ((uVar24 != uVar25) && (bVar43 = false, uVar26 < 0x20)) {
                  uVar24 = codespan_last_potential_closers[(ulong)uVar26 - 1];
                  if (codespan_last_potential_closers[(ulong)uVar26 - 1] < uVar25) {
                    uVar24 = uVar25;
                  }
                  codespan_last_potential_closers[(ulong)uVar26 - 1] = uVar24;
                }
              } while (bVar42);
              uVar21 = (int)local_138 + 1;
              local_138 = (ulong)uVar21;
              if ((uint)local_110 - iVar16 <= uVar21) goto LAB_00108fd0;
              uVar6 = (ulong)lines_00[uVar21].beg;
              uVar21 = lines_00[uVar21].end;
            } while( true );
          }
          goto LAB_00107d37;
        default:
          if (uVar39 == 0x2e) {
            if ((uVar13 < lines_00->beg + 3) ||
               (uVar3 = uVar13 - 3,
               *(char *)((long)&pMVar33->text + (ulong)uVar3 + 2) != 'w' ||
               *(short *)((long)&pMVar33->text + (ulong)uVar3) != 0x7777)) goto LAB_0010897d;
            if (uVar3 != lines_00->beg) {
              uVar39 = md_decode_utf8_before__(pMVar33,uVar3);
              ctx = ctx_00;
              iVar16 = md_is_unicode_whitespace__(uVar39);
              ctx_00 = ctx;
              if ((iVar16 == 0) &&
                 (iVar16 = md_is_unicode_punct__(uVar39), ctx_00 = ctx, iVar16 == 0))
              goto LAB_0010897d;
            }
            pMVar10 = md_add_mark(ctx);
            if (pMVar10 == (MD_MARK *)0x0) goto LAB_00109aa0;
            pMVar10->beg = uVar3;
            uVar17 = (ulong)(uVar13 + 1);
            pMVar10->end = uVar13 + 1;
            pMVar10->prev = -1;
            pMVar10->next = -1;
            pMVar10->ch = '.';
            pMVar10->flags = '\x01';
            pMVar10 = md_add_mark(ctx_00);
            if (pMVar10 == (MD_MARK *)0x0) goto LAB_00109aa0;
            MVar22 = lines_00->end;
            pMVar10->beg = lines_00->beg;
            pMVar10->end = MVar22;
            pMVar10->prev = -1;
            pMVar10->next = -1;
            pMVar10->ch = 'D';
            pMVar10->flags = '\0';
            ctx = ctx_00;
            pMVar44 = ctx_00;
            goto LAB_00107d37;
          }
        }
        goto switchD_001080bb_caseD_5c;
      }
LAB_0010897d:
      uVar17 = (ulong)(uVar13 + 1);
      pMVar44 = ctx_00;
      goto LAB_00107d37;
    }
    if (uVar39 != 0x21) {
      if (uVar39 != 0x26) {
        if (uVar39 == 0x2a) goto switchD_001080bb_caseD_5f;
        goto switchD_001080bb_caseD_5c;
      }
      pMVar10 = md_add_mark(ctx);
      if (pMVar10 == (MD_MARK *)0x0) goto LAB_00109aa0;
      pMVar10->beg = uVar13;
      uVar17 = (ulong)(uVar13 + 1);
      pMVar10->end = uVar13 + 1;
      pMVar10->prev = -1;
      pMVar10->next = -1;
      pMVar10->ch = '&';
      pMVar10->flags = '\x01';
      ctx = ctx_00;
      pMVar44 = ctx_00;
      goto LAB_00107d37;
    }
    if (((uint)(uVar9 + 1) < uVar3) &&
       (iVar16 = 2, *(char *)((long)&pMVar33->text + uVar9 + 1) == '[')) goto LAB_001080e0;
switchD_001080bb_caseD_5c:
    if (local_e4 == 0) {
      if ((bVar20 == 0x7c) && (((ctx->parser).flags & 0x2000) != 0)) {
LAB_001085a4:
        pMVar10 = md_add_mark(ctx);
        if (pMVar10 == (MD_MARK *)0x0) goto LAB_00109aa0;
        pMVar10->beg = uVar13;
        uVar17 = (ulong)(uVar13 + 1);
        pMVar10->end = uVar13 + 1;
        pMVar10->prev = -1;
        pMVar10->next = -1;
        pMVar10->ch = bVar20;
        pMVar10->flags = '\0';
        ctx = ctx_00;
        pMVar44 = ctx_00;
        goto LAB_00107d37;
      }
      if (uVar39 < 0x25) {
        uVar9 = (ulong)uVar39;
        if ((0x100001a00U >> (uVar9 & 0x3f) & 1) != 0) goto LAB_001085ea;
        if (uVar9 == 0) goto LAB_001086ec;
        if (uVar9 == 0x24) goto LAB_00108660;
      }
      if (uVar39 != 0x7e) goto LAB_0010897d;
    }
    else {
      if (uVar39 < 0x25) {
        uVar9 = (ulong)uVar39;
        if ((0x100001a00U >> (uVar9 & 0x3f) & 1) == 0) {
          if (uVar9 != 0) {
            if (uVar9 == 0x24) goto LAB_00108660;
            goto LAB_0010857f;
          }
LAB_001086ec:
          pMVar10 = md_add_mark(ctx);
          if (pMVar10 == (MD_MARK *)0x0) goto LAB_00109aa0;
          pMVar10->beg = uVar13;
          uVar17 = (ulong)(uVar13 + 1);
        }
        else {
LAB_001085ea:
          uVar17 = (ulong)(uVar13 + 1);
          if (uVar13 + 1 < uVar3) {
            uVar17 = uVar28 & 0xffffffff;
            do {
              uVar6 = (ulong)*(byte *)((long)&pMVar33->text + uVar17);
              if ((0x20 < uVar6) || ((0x100001a00U >> (uVar6 & 0x3f) & 1) == 0)) goto LAB_0010861c;
              uVar17 = uVar17 + 1;
            } while (uVar17 < uVar40);
            uVar17 = (ulong)uVar3;
          }
LAB_0010861c:
          if ((bVar20 == 0x20) && ((int)uVar17 - uVar13 < 2)) goto LAB_00107d37;
          pMVar10 = md_add_mark(ctx);
          if (pMVar10 == (MD_MARK *)0x0) goto LAB_00109aa0;
          pMVar10->beg = uVar13;
        }
        pMVar10->end = (MD_OFFSET)uVar17;
        pMVar10->prev = -1;
        pMVar10->next = -1;
        pMVar10->ch = bVar20;
        pMVar10->flags = '\x10';
        ctx = ctx_00;
        pMVar44 = ctx_00;
        goto LAB_00107d37;
      }
LAB_0010857f:
      if (uVar39 != 0x7e) {
        if (uVar39 == 0x7c) goto LAB_001085a4;
        goto LAB_0010897d;
      }
    }
LAB_00108660:
    uVar35 = (ulong)uVar3;
    uVar9 = uVar17;
    if (uVar3 <= (uint)uVar28) {
      uVar35 = uVar28 & 0xffffffff;
    }
    do {
      uVar28 = uVar6;
      uVar17 = uVar35;
      if (uVar40 <= uVar28) break;
      uVar17 = (ulong)((int)uVar9 + 1);
      uVar6 = uVar28 + 1;
      uVar9 = uVar17;
    } while (*(byte *)((long)&pMVar33->text + uVar28) == bVar20);
    MVar22 = (MD_OFFSET)uVar17;
    if (MVar22 - uVar13 < 3) {
      bVar19 = 3;
      if (lines_00->beg < uVar13) {
        uVar3 = md_decode_utf8_before__(pMVar33,uVar13);
        ctx = ctx_00;
        iVar16 = md_is_unicode_whitespace__(uVar3);
        ctx_00 = ctx;
        if (iVar16 == 0) {
          iVar16 = md_is_unicode_punct__(uVar3);
          bVar19 = 3 - (iVar16 == 0);
          ctx_00 = ctx;
        }
      }
      if (uVar28 < uVar40) {
        pMVar34 = (MD_CHAR *)((long)&pMVar33->text + uVar17);
        MVar23 = ctx->size - MVar22;
        uVar3 = md_decode_utf8__(pMVar34,MVar23,(MD_SIZE *)0x0);
        ctx = ctx_00;
        iVar16 = md_is_unicode_whitespace__(uVar3);
        ctx_00 = ctx;
        if (iVar16 == 0) {
          uVar3 = md_decode_utf8__(pMVar34,MVar23,(MD_SIZE *)0x0);
          iVar16 = md_is_unicode_punct__(uVar3);
          ctx_00 = ctx;
          if ((iVar16 == 0) && (bVar14 = bVar19 & 1, bVar19 = 1, pMVar44 = ctx, bVar14 == 0))
          goto LAB_00107d37;
        }
      }
      pMVar10 = md_add_mark(ctx);
      if (pMVar10 == (MD_MARK *)0x0) goto LAB_00109aa0;
      pMVar10->beg = uVar13;
      pMVar10->end = MVar22;
      pMVar10->prev = -1;
      pMVar10->next = -1;
      pMVar10->ch = bVar20;
      pMVar10->flags = bVar19;
      ctx = ctx_00;
      pMVar44 = ctx_00;
    }
    goto LAB_00107d37;
  }
LAB_00109072:
  pMVar10 = md_add_mark(ctx);
  if (pMVar10 == (MD_MARK *)0x0) {
LAB_00109aa0:
    iVar29 = -1;
  }
  else {
    MVar22 = ctx_00->size;
    pMVar10->beg = MVar22;
    pMVar10->end = MVar22;
    pMVar10->prev = -1;
    pMVar10->next = -1;
    pMVar10->ch = '\x7f';
    pMVar10->flags = '\x10';
    iVar16 = 0x10d960;
    uVar3 = 0;
    pMVar44 = ctx_00;
    md_analyze_marks(ctx_00,(MD_LINE *)(ulong)lines->beg,0,ctx_00->n_marks,0x10d960,(MD_CHAR *)0x0,
                     (uint)ctx_00);
    uVar5 = (ulong)(uint)ctx_00->unresolved_link_head;
    if (-1 < ctx_00->unresolved_link_head) {
      local_d8 = (MD_OFFSET *)CONCAT44(local_d8._4_4_,(int)local_110 + -1);
      MVar22 = 0;
      uVar13 = 0;
      local_f8 = local_f8 & 0xffffffff00000000;
LAB_001090f4:
      pMVar10 = ctx_00->marks;
      pMVar33 = (MD_CTX *)(uVar5 * 5);
      uVar17 = (ulong)pMVar10[uVar5].prev;
      if ((long)uVar17 < 0) {
        pMVar27 = (MD_MARK *)0x0;
        local_150 = (MD_CTX *)0x0;
      }
      else {
        pMVar27 = pMVar10 + uVar17;
        local_150 = (MD_CTX *)(pMVar10 + pMVar27->next);
      }
      pMVar41 = pMVar10 + uVar5;
      uVar39 = pMVar41->next;
      pMVar30 = (MD_OFFSET *)(ulong)uVar39;
      pMVar38 = (MD_OFFSET *)((long)(int)uVar39 * 5);
      pMVar36 = pMVar10 + (int)uVar39;
      uVar21 = pMVar41->beg;
      if ((((uVar21 < uVar3) && (pMVar36->end < MVar22)) ||
          ((uVar21 < uVar13 && (pMVar36->end < (uint)local_f8)))) ||
         ((uVar21 < MVar22 && (pMVar41->ch == '[')))) {
LAB_0010975f:
        iVar16 = (int)pMVar33;
      }
      else {
        local_118 = pMVar30;
        local_108 = uVar5;
        local_d0 = pMVar38;
        local_c8 = pMVar33;
        if ((((ctx_00->parser).flags & 0x2000) != 0) && (pMVar27 != (MD_MARK *)0x0)) {
          uVar25 = pMVar41->end;
          if (uVar25 - uVar21 != 1) goto LAB_001091c8;
          uVar26 = pMVar27->beg;
          if ((((pMVar27->ch != '[') || (uVar26 != uVar21 - 1)) || (pMVar27->end - uVar26 != 1)) ||
             ((local_150 == (MD_CTX *)0x0 || ((char)(local_150->parser).abi_version != ']'))))
          goto LAB_001091d9;
          uVar24 = pMVar36->beg;
          if ((*(MD_OFFSET *)&local_150->text != uVar24 + 1) ||
             (MVar37 = *(MD_OFFSET *)((long)&local_150->text + 4),
             MVar37 - *(MD_OFFSET *)&local_150->text != 1)) goto LAB_001091d9;
          iVar29 = (int)uVar5;
          local_f0 = uVar5;
          iVar16 = iVar29;
          while (closer_index = iVar16 + 1, (int)closer_index < (int)uVar39) {
            uVar5 = (ulong)closer_index;
            if (pMVar10[(int)closer_index].ch != 'D') {
              local_100 = pMVar10 + (int)closer_index;
              if (pMVar10[(int)closer_index].ch == '|') goto LAB_001098a5;
              if (100 < local_100->beg - uVar25) break;
              if ((local_100->flags & 4) != 0) {
                uVar5 = (ulong)(uint)local_100->next;
              }
            }
            local_f0 = uVar5;
            iVar16 = (int)uVar5;
          }
          local_100 = (MD_MARK *)0x0;
LAB_001098a5:
          pMVar31 = local_100;
          if (local_100 == (MD_MARK *)0x0) {
            pMVar31 = pMVar36;
          }
          uVar2 = pMVar31->beg;
          pMVar33 = (MD_CTX *)(ulong)uVar2;
          if ((uVar2 == uVar25) || (100 < uVar2 - uVar25)) goto LAB_001091c8;
          if (uVar25 < uVar2) {
            pMVar33 = (MD_CTX *)0x0;
            do {
              cVar1 = *(char *)((long)&pMVar33->text + (long)(ctx_00->text + uVar25));
              if ((cVar1 == '\n') || (cVar1 == '\r')) goto LAB_001091c8;
              pMVar33 = (MD_CTX *)((long)&pMVar33->text + 1);
            } while (uVar2 - uVar25 != (uint)pMVar33);
          }
          iVar16 = (int)pMVar33;
          if (local_100 == (MD_MARK *)0x0) {
            bVar43 = true;
            iVar4 = (int)local_f0;
            MVar22 = MVar37;
          }
          else {
            bVar42 = local_100->end < uVar24;
            bVar43 = !bVar42;
            if (bVar42) {
              pMVar10 = (MD_MARK *)&pMVar41->end;
              md_rollback(ctx_00,iVar29,closer_index,1);
              lVar12 = 0;
              uVar39 = (uint)local_118;
              iVar4 = (int)local_f0;
              do {
                uVar3 = pMVar44->opener_stacks[lVar12].top;
                while (iVar16 = (int)pMVar33, iVar4 < (int)uVar3) {
                  if (-1 < (int)uVar3) {
                    pMVar33 = (MD_CTX *)pMVar44->marks;
                    uVar3 = *(uint *)(&pMVar33->field_0xc + (ulong)uVar3 * 0x14);
                    pMVar44->opener_stacks[lVar12].top = uVar3;
                  }
                }
                lVar12 = lVar12 + 1;
              } while (lVar12 != 0x10);
              local_100->flags = local_100->flags | 0x10;
              ctx_00 = pMVar44;
            }
            else {
              md_rollback(ctx_00,iVar29,uVar39,1);
              iVar4 = (int)local_f0;
              pMVar10 = pMVar36;
              ctx_00 = pMVar44;
            }
            pMVar10->beg = local_100->beg;
            uVar26 = pMVar27->beg;
            iVar29 = (int)local_108;
            MVar22 = *(MD_OFFSET *)((long)&local_150->text + 4);
            pMVar44 = ctx_00;
          }
          pMVar41->beg = uVar26;
          pMVar41->next = uVar39;
          pMVar41->flags = pMVar41->flags | 0x14;
          pMVar36->end = MVar22;
          pMVar36->prev = iVar29;
          pMVar36->flags = pMVar36->flags | 0x18;
          if (!bVar43) {
            md_analyze_link_contents(ctx_00,lines,iVar4 + 2,uVar39,iVar16);
            ctx_00 = pMVar44;
            pMVar44 = ctx_00;
          }
          uVar17 = (ulong)(uint)pMVar27->prev;
          uVar3 = uVar26;
          goto LAB_00109772;
        }
LAB_001091c8:
        if (pMVar27 == (MD_MARK *)0x0) {
          uVar39 = pMVar36->end;
LAB_001092ee:
          uVar21 = ctx_00->size;
          local_150 = pMVar33;
          if ((uVar39 < uVar21) &&
             (pMVar33 = (MD_CTX *)ctx_00->text, local_150 = pMVar33,
             *(char *)((long)&pMVar33->text + (ulong)uVar39) == '(')) {
            uVar26 = 0;
            uVar25 = (uint)local_d8;
            do {
              uVar24 = uVar25 + uVar26 >> 1;
              pMVar27 = (MD_MARK *)(ulong)uVar24;
              if (uVar39 < lines[(long)pMVar27].beg) {
                if ((uVar25 == 0) || (lines[uVar25 - 1].end < uVar39)) goto LAB_00109349;
                uVar25 = uVar24 - 1;
              }
              else {
                if (uVar39 <= lines[(long)pMVar27].end) goto LAB_00109349;
                uVar26 = uVar24 + 1;
              }
            } while (uVar26 <= uVar25);
            pMVar27 = (MD_MARK *)0x0;
LAB_00109349:
            uVar25 = lines[(long)pMVar27].end;
            MVar37 = uVar39 + 1;
            local_120 = MVar37;
            if (MVar37 < uVar25) {
              pbVar18 = (byte *)((long)&pMVar33->text + (ulong)MVar37);
              do {
                if ((0x20 < (ulong)*pbVar18) ||
                   ((0x100001a00U >> ((ulong)*pbVar18 & 0x3f) & 1) == 0)) goto LAB_001093b8;
                MVar37 = MVar37 + 1;
                pbVar18 = pbVar18 + 1;
                local_120 = uVar25;
              } while (uVar25 != MVar37);
            }
            if (((uVar21 <= local_120) ||
                (cVar1 = *(char *)((long)&pMVar33->text + (ulong)local_120), cVar1 == '\r')) ||
               (MVar37 = local_120, cVar1 == '\n')) {
              uVar39 = (int)pMVar27 + 1;
              pMVar27 = (MD_MARK *)(ulong)uVar39;
              if ((uint)local_110 <= uVar39) goto LAB_001095d0;
              MVar37 = lines[uVar39].beg;
            }
LAB_001093b8:
            uVar39 = (uint)pMVar27;
            local_120 = MVar37;
            if ((MVar37 < uVar21) && (*(char *)((long)&pMVar33->text + (ulong)MVar37) == ')')) {
              codespan_last_potential_closers[1] = MVar37;
              codespan_last_potential_closers[0] = MVar37;
LAB_0010980b:
              codespan_last_potential_closers[2] = 0;
              codespan_last_potential_closers[3] = 0;
              codespan_last_potential_closers[4] = 0;
              codespan_last_potential_closers[5] = 0;
              bVar43 = true;
LAB_00109820:
              uVar39 = MVar37 + 1;
              iVar16 = (int)local_118 + 1;
              if (iVar16 < ctx_00->n_marks) {
                pMVar27 = ctx_00->marks;
                do {
                  if (uVar39 <= pMVar27[iVar16].beg) break;
                  pMVar33 = (MD_CTX *)CONCAT71((int7)((ulong)pMVar33 >> 8),~pMVar27[iVar16].flags);
                  if (((~pMVar27[iVar16].flags & 0x14) == 0) &&
                     (iVar16 = pMVar27[iVar16].next, uVar39 <= pMVar27[iVar16].beg)) {
                    local_150 = pMVar33;
                    if (!bVar43) {
                      ctx_00 = pMVar44;
                      free((void *)codespan_last_potential_closers._8_8_);
                      local_150 = pMVar33;
                      pMVar44 = ctx_00;
                    }
                    goto LAB_001095d0;
                  }
                  iVar16 = iVar16 + 1;
                } while (iVar16 < ctx_00->n_marks);
              }
              pMVar36->end = uVar39;
              iVar29 = (int)local_108;
              goto LAB_00109621;
            }
            max_end = lines[(long)pMVar27].end;
            local_150 = (MD_CTX *)codespan_last_potential_closers;
            p_size = (MD_SIZE *)0x10948b;
            ctx_00 = pMVar44;
            local_100 = pMVar27;
            iVar16 = md_is_link_destination
                               (pMVar33,MVar37,max_end,&local_120,(MD_OFFSET *)local_150,
                                codespan_last_potential_closers + 1);
            pMVar44 = ctx_00;
            if (iVar16 != 0) {
              iVar16 = md_is_link_title(ctx_00,lines + (long)local_100,(int)local_110 - uVar39,
                                        local_120,&local_120,&local_bc,&tmp_line_index,
                                        &title_contents_beg,&title_contents_end);
              if (iVar16 == 0) {
                title_contents_beg = local_120;
                title_contents_end = local_120;
                uVar21 = 0;
              }
              else {
                uVar21 = local_bc + uVar39;
                uVar39 = tmp_line_index + uVar39;
                max_end = lines[uVar39].end;
              }
              pMVar44 = ctx_00;
              if (local_120 < max_end) {
                pbVar18 = (byte *)((long)&pMVar33->text + (ulong)local_120);
                MVar37 = local_120;
                do {
                  if ((0x20 < (ulong)*pbVar18) ||
                     ((0x100001a00U >> ((ulong)*pbVar18 & 0x3f) & 1) == 0)) goto LAB_0010957e;
                  MVar37 = MVar37 + 1;
                  pbVar18 = pbVar18 + 1;
                } while (max_end != MVar37);
              }
              local_150 = pMVar33;
              if (uVar39 + 1 < (uint)local_110) {
                MVar37 = lines[uVar39 + 1].beg;
LAB_0010957e:
                local_150 = pMVar33;
                if (*(char *)((long)&pMVar33->text + (ulong)MVar37) == ')') {
                  if (title_contents_end <= title_contents_beg) goto LAB_0010980b;
                  if (iVar16 == 0 || tmp_line_index == local_bc) {
                    pMVar33 = (MD_CTX *)((long)&pMVar33->text + (ulong)title_contents_beg);
                    codespan_last_potential_closers[5] = 0;
                    codespan_last_potential_closers[4] = title_contents_end - title_contents_beg;
                    bVar43 = true;
                    codespan_last_potential_closers._8_8_ = pMVar33;
                    goto LAB_00109820;
                  }
                  pMVar33 = (MD_CTX *)0xa;
                  iVar16 = md_merge_lines_alloc
                                     (ctx_00,title_contents_beg,title_contents_end,lines + uVar21,10
                                      ,(char)codespan_last_potential_closers + '\b',
                                      (MD_CHAR **)(codespan_last_potential_closers + 4),p_size);
                  if (iVar16 < 0) goto LAB_00109aa0;
                  codespan_last_potential_closers[5] = 1;
                  bVar43 = false;
                  pMVar44 = ctx_00;
                  goto LAB_00109820;
                }
              }
            }
          }
LAB_001095d0:
          if ((pMVar41->flags & 0x20) != 0) {
LAB_00109766:
            iVar16 = (int)local_150;
            goto LAB_00109772;
          }
          pMVar33 = (MD_CTX *)(ulong)pMVar36->end;
          iVar16 = md_is_link_reference
                             (ctx_00,lines,(MD_SIZE)local_110,pMVar41->beg,pMVar36->end,
                              (MD_LINK_ATTR *)codespan_last_potential_closers);
          ctx_00 = pMVar44;
          iVar29 = (int)local_108;
          if (-1 < iVar16) {
            pMVar44 = ctx_00;
            if (iVar16 != 0) goto LAB_00109621;
            goto LAB_0010975f;
          }
          goto LAB_00109aa0;
        }
        uVar26 = pMVar27->beg;
LAB_001091d9:
        uVar39 = pMVar36->end;
        pMVar33 = local_150;
        if (uVar26 != uVar39) goto LAB_001092ee;
        if (uVar26 + 1 < *(uint *)&local_150->text) {
          if ((pMVar27->flags & 0x20) == 0) {
            uVar21 = uVar26;
            uVar26 = *(MD_OFFSET *)((long)&local_150->text + 4);
            goto LAB_001093f9;
          }
          goto LAB_00109766;
        }
        if ((pMVar41->flags & 0x20) != 0) goto LAB_00109766;
LAB_001093f9:
        pMVar33 = (MD_CTX *)(ulong)uVar26;
        iVar4 = md_is_link_reference
                          (ctx_00,lines,(uint)local_110,uVar21,uVar26,
                           (MD_LINK_ATTR *)codespan_last_potential_closers);
        ctx_00 = pMVar44;
        iVar16 = (int)pMVar33;
        iVar29 = (int)local_108;
        if (iVar4 < 0) goto LAB_00109aa0;
        pMVar44 = ctx_00;
        if (iVar4 == 0) goto LAB_00109772;
        pMVar36->end = *(MD_OFFSET *)((long)&local_150->text + 4);
        uVar17 = (ulong)(uint)ctx_00->marks[uVar17].prev;
LAB_00109621:
        pMVar41->flags = pMVar41->flags | 0x14;
        pMVar36->flags = pMVar36->flags | 0x18;
        pMVar31 = ctx_00->marks;
        pMVar27 = pMVar31 + (iVar29 + 1U);
        pMVar27->beg = codespan_last_potential_closers[0];
        pMVar27->end = codespan_last_potential_closers[1];
        uVar39 = iVar29 + 2;
        pMVar31 = pMVar31 + uVar39;
        pMVar31->beg = codespan_last_potential_closers[2];
        pMVar31->end = codespan_last_potential_closers[3];
        pMVar27 = ctx_00->marks;
        if (codespan_last_potential_closers[5] != 0) {
          pMVar27[uVar39].next = (ctx_00->ptr_stack).top;
          (ctx_00->ptr_stack).top = uVar39;
        }
        pMVar27[uVar39].prev = codespan_last_potential_closers[4];
        bVar43 = pMVar41->ch != '[';
        MVar37 = (uint)local_f8;
        if (bVar43) {
          MVar37 = pMVar36->end;
        }
        local_f8 = CONCAT44(local_f8._4_4_,MVar37);
        uVar39 = pMVar41->beg;
        if (!bVar43) {
          uVar3 = pMVar41->beg;
          uVar39 = uVar13;
          MVar22 = pMVar36->end;
        }
        uVar13 = uVar39;
        md_analyze_link_contents(ctx_00,lines,iVar29 + 1U,(int)local_118,(int)pMVar33);
        ctx_00 = pMVar44;
        iVar16 = (int)pMVar33;
        pMVar44 = ctx_00;
        if (((ctx_00->parser).flags & 0x40c) != 0) {
          pMVar27 = (MD_MARK *)(&pMVar10[1].beg + (long)local_c8);
          do {
            pMVar31 = pMVar27;
            cVar1 = pMVar31->ch;
            if (cVar1 != 0x44) break;
            pMVar27 = pMVar31 + 1;
          } while (pMVar31 < pMVar36);
          pMVar38 = &pMVar10->beg + (long)local_d0;
          pMVar10 = (MD_MARK *)(&pMVar10[-1].beg + (long)local_d0);
          do {
            pMVar27 = pMVar10;
            pMVar38 = pMVar38 + -5;
            if (cVar1 != 'D') break;
            pMVar10 = pMVar27 + -1;
          } while (pMVar41 < pMVar27);
          bVar20 = pMVar31->flags;
          if ((((bVar20 & 0x10) != 0) && (cVar1 != '\0')) && (pMVar31->beg == pMVar41->end)) {
            pvVar11 = memchr("@:.",(int)cVar1,4);
            iVar16 = (int)pMVar33;
            pMVar44 = ctx_00;
            if (pvVar11 == (void *)0x0) goto LAB_00109772;
            if ((((long)pMVar38 - (long)ctx_00->marks >> 2) * -0x3333333333333333 -
                 (long)pMVar31->next == 0) && (pMVar27->end == pMVar36->beg)) {
              pMVar31->ch = 'D';
              pMVar31->flags = bVar20 & 0xef;
              pMVar27->ch = 'D';
              pMVar27->flags = pMVar27->flags & 0xef;
            }
          }
          goto LAB_0010975f;
        }
      }
LAB_00109772:
      uVar5 = uVar17 & 0xffffffff;
      if ((int)uVar17 < 0) goto LAB_00109aa7;
      goto LAB_001090f4;
    }
LAB_00109aa7:
    ctx_00->opener_stacks[0xe].top = -1;
    ctx_00->unresolved_link_head = -1;
    ctx_00->unresolved_link_tail = -1;
    if (local_e4 == 0) {
      iVar29 = 0;
      md_analyze_link_contents(ctx_00,lines,0,ctx_00->n_marks,iVar16);
    }
    else {
      ctx_00->n_table_cell_boundaries = 0;
      iVar29 = 0;
      md_analyze_marks(ctx_00,(MD_LINE *)(ulong)lines->beg,0,ctx_00->n_marks,0x10d964,(MD_CHAR *)0x0
                       ,(uint)pMVar44);
    }
  }
  return iVar29;
  while( true ) {
    uVar39 = (uint)uVar17 + 1;
    uVar17 = (ulong)uVar39;
    pcVar7 = pcVar7 + 1;
    uVar25 = uVar3;
    if (uVar3 == uVar39) break;
LAB_00108e6e:
    if ((*pcVar7 != ' ') && (uVar25 = (uint)uVar17, *pcVar7 != '\t')) break;
  }
LAB_00108e89:
  pMVar10 = md_add_mark(ctx_00);
  if (pMVar10 == (MD_MARK *)0x0) goto LAB_00109aa0;
  pMVar10->beg = uVar13;
  pMVar10->end = MVar22;
  pMVar10->prev = -1;
  pMVar10->next = -1;
  pMVar10->ch = '`';
  pMVar10->flags = '\x01';
  pMVar10 = md_add_mark(ctx_00);
  if (pMVar10 == (MD_MARK *)0x0) goto LAB_00109aa0;
  pMVar10->beg = uVar25;
  pMVar10->end = uVar24;
  pMVar10->prev = -1;
  pMVar10->next = -1;
  pMVar10->ch = '`';
  pMVar10->flags = '\x02';
  iVar16 = ctx_00->n_marks;
  pMVar10 = ctx_00->marks;
  pMVar10[(long)iVar16 + -2].next = iVar16 + -1;
  pMVar10[(long)iVar16 + -1].prev = iVar16 + -2;
  pMVar10[(long)iVar16 + -2].flags = pMVar10[(long)iVar16 + -2].flags | 0x14;
  pMVar10[(long)iVar16 + -1].flags = pMVar10[(long)iVar16 + -1].flags | 0x18;
  uVar17 = uVar6 & 0xffffffff;
  ctx = ctx_00;
  pMVar44 = ctx_00;
  if (lines_00->end < uVar24) {
    uVar3 = 0;
    uVar5 = local_f8;
    do {
      iVar16 = (int)uVar5;
      uVar13 = iVar16 + uVar3 >> 1;
      lines_00 = lines + uVar13;
      if (uVar24 < lines_00->beg) {
        if ((iVar16 == 0) || (lines[iVar16 - 1].end < uVar24)) {
LAB_00108f5a:
          uVar17 = uVar6 & 0xffffffff;
          uVar5 = (ulong)uVar13;
          goto LAB_00107d37;
        }
        uVar5 = (ulong)(uVar13 - 1);
      }
      else {
        if (uVar24 <= lines_00->end) goto LAB_00108f5a;
        uVar3 = uVar13 + 1;
      }
    } while (uVar3 <= (uint)uVar5);
    uVar17 = uVar6 & 0xffffffff;
LAB_00108f52:
    lines_00 = (MD_LINE *)0x0;
    ctx = ctx_00;
    uVar5 = local_128;
  }
  goto LAB_00107d37;
LAB_00108fd0:
  local_108 = CONCAT44(local_108._4_4_,1);
  ctx = ctx_00;
  goto LAB_00107d37;
LAB_00108d1f:
  bVar20 = *(byte *)((long)&pMVar33->text + uVar40);
  uVar28 = (ulong)bVar20;
  MVar37 = (MD_OFFSET)uVar9;
  if (uVar28 < 0x3f) {
    if ((0x100001a00U >> (uVar28 & 0x3f) & 1) != 0) goto LAB_00108d73;
    if (uVar28 == 0x3e) {
      bVar20 = 0x30;
      goto LAB_00108fe2;
    }
  }
  if (((bVar20 < 0x20) || (bVar20 == 0x3c)) || (bVar20 == 0x7f)) goto LAB_00108d73;
  uVar40 = uVar40 + 1;
  uVar9 = (ulong)(MVar37 + 1);
  if (uVar3 <= uVar40) goto LAB_00108d73;
  goto LAB_00108d1f;
LAB_00108de0:
  MVar37 = (MD_OFFSET)uVar35;
  if (uVar3 <= (uint)uVar9) goto LAB_00107d37;
  bVar20 = *(byte *)((long)&pMVar33->text + uVar9);
  if ((((byte)(bVar20 - 0x30) < 10) || ((byte)((bVar20 & 0xdf) + 0xbf) < 0x1a)) ||
     ((0 < iVar16 && (bVar20 == 0x2d)))) {
    iVar16 = iVar16 + 1;
  }
  else {
    if ((iVar16 < 1) || (bVar20 != 0x2e)) {
      if ((0 < iVar16) &&
         ((bVar20 == 0x3e &&
          (bVar20 = 0x70, *(char *)((long)&pMVar33->text + (ulong)(MVar37 - 2)) != '-'))))
      goto LAB_00108fe2;
      goto LAB_00107d37;
    }
    iVar16 = 0;
    if (*(char *)((long)&pMVar33->text + (ulong)(MVar37 - 2)) == '-') goto LAB_00107d37;
  }
  uVar35 = (ulong)(MVar37 + 1);
  uVar9 = uVar9 + 1;
  if (0x3f < iVar16) goto LAB_00107d37;
  goto LAB_00108de0;
LAB_00108fe2:
  pMVar10 = md_add_mark(ctx);
  if (pMVar10 == (MD_MARK *)0x0) goto LAB_00109aa0;
  pMVar10->beg = uVar13;
  pMVar10->end = uVar39;
  pMVar10->prev = -1;
  pMVar10->next = -1;
  pMVar10->ch = '<';
  pMVar10->flags = bVar20 | 4;
  pMVar10 = md_add_mark(ctx_00);
  if (pMVar10 == (MD_MARK *)0x0) goto LAB_00109aa0;
  pMVar10->beg = MVar37 - 1;
  pMVar10->end = MVar37;
  pMVar10->prev = -1;
  pMVar10->next = -1;
  pMVar10->ch = '>';
  pMVar10->flags = bVar20 | 8;
  iVar16 = ctx_00->n_marks;
  pMVar10 = ctx_00->marks;
  pMVar10[(long)iVar16 + -2].next = iVar16 + -1;
  pMVar10[(long)iVar16 + -1].prev = iVar16 + -2;
LAB_00108088:
  uVar17 = (ulong)MVar37;
  ctx = ctx_00;
  pMVar44 = ctx_00;
  goto LAB_00107d37;
LAB_00109061:
  uVar5 = (ulong)(iVar16 + 1U);
  if ((uint)local_110 <= iVar16 + 1U) goto LAB_00109072;
  goto LAB_00107d24;
}

Assistant:

static int
md_analyze_inlines(MD_CTX* ctx, const MD_LINE* lines, MD_SIZE n_lines, int table_mode)
{
    int ret;

    /* Reset the previously collected stack of marks. */
    ctx->n_marks = 0;

    /* Collect all marks. */
    MD_CHECK(md_collect_marks(ctx, lines, n_lines, table_mode));

    /* (1) Links. */
    md_analyze_marks(ctx, lines, n_lines, 0, ctx->n_marks, _T("[]!"), 0);
    MD_CHECK(md_resolve_links(ctx, lines, n_lines));
    BRACKET_OPENERS.top = -1;
    ctx->unresolved_link_head = -1;
    ctx->unresolved_link_tail = -1;

    if(table_mode) {
        /* (2) Analyze table cell boundaries. */
        MD_ASSERT(n_lines == 1);
        ctx->n_table_cell_boundaries = 0;
        md_analyze_marks(ctx, lines, n_lines, 0, ctx->n_marks, _T("|"), 0);
        return ret;
    }

    /* (3) Emphasis and strong emphasis; permissive autolinks. */
    md_analyze_link_contents(ctx, lines, n_lines, 0, ctx->n_marks);

abort:
    return ret;
}